

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O3

bool __thiscall
mocker::detail::InterferenceGraph::isCoalesceAbleToAMachineReg
          (InterferenceGraph *this,Node *v,Node *r)

{
  key_type *__k;
  element_type *peVar1;
  bool bVar2;
  iterator iVar3;
  const_iterator cVar4;
  iterator iVar5;
  undefined8 uVar6;
  long *plVar7;
  __hashtable *__h;
  Node local_58;
  Node local_48;
  Node *local_38;
  
  local_38 = r;
  iVar3 = std::
          _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->originalAdjList)._M_h,v);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_0013079b:
    std::__throw_out_of_range("_Map_base::at");
  }
  plVar7 = *(long **)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>,_true>
                            ._M_cur + 0x28);
  if (plVar7 != (long *)0x0) {
    do {
      __k = (key_type *)(plVar7 + 1);
      cVar4 = std::
              _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->coalesced)._M_h,__k);
      if ((cVar4.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>._M_cur ==
           (__node_type *)0x0) &&
         (cVar4 = std::
                  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&(this->removed)._M_h,__k),
         cVar4.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>._M_cur ==
         (__node_type *)0x0)) {
        iVar5 = std::
                _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->curDegree)._M_h,__k);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_0013079b;
        if (0xd < *(ulong *)((long)iVar5.
                                   super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
                                   ._M_cur + 0x18)) {
          peVar1 = (__k->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if ((peVar1->identifier)._M_string_length == 0) {
            uVar6 = std::__throw_out_of_range_fmt
                              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
            if (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_58.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_48.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_48.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            _Unwind_Resume(uVar6);
          }
          if (*(peVar1->identifier)._M_dataplus._M_p == 'v') {
            local_48.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[2];
            if (local_48.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_48.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_48.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_48.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_48.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (local_38->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
            local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (local_38->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_58.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_58.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_48.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar1;
            bVar2 = isAdjacent(this,&local_48,&local_58);
            if (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_58.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_48.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_48.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (!bVar2) {
              return false;
            }
          }
        }
      }
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  return true;
}

Assistant:

bool InterferenceGraph::isCoalesceAbleToAMachineReg(const Node &v,
                                                    const Node &r) {
  // Do not use getCurAdjList here.
  // This condition usually fails very soon, whence we do need to build the
  // entire adjacent list.

  for (auto &t : originalAdjList.at(v)) {
    // Note that since most nodes removed are of degree < K, we may omit the
    // isIn(removed, t) here to speed up the process.
    if (isIn(coalesced, t) || isIn(removed, t))
      continue;
    if (curDegree.at(t) < K)
      continue;
    if (isPrecolored(t))
      continue;
    if (isAdjacent(t, r))
      continue;
    return false;
  }
  return true;
}